

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystem.cpp
# Opt level: O0

void __thiscall
solitaire::graphics::SDLGraphicsSystem::renderTextureInFullWindow
          (SDLGraphicsSystem *this,TextureId *id)

{
  int iVar1;
  pointer pWVar2;
  uint *puVar3;
  const_reference pvVar4;
  runtime_error *this_00;
  optional<SDL_Rect> local_48;
  optional<SDL_Rect> local_30;
  TextureId local_1c;
  TextureId *local_18;
  TextureId *id_local;
  SDLGraphicsSystem *this_local;
  
  local_18 = id;
  id_local = (TextureId *)this;
  TextureId::TextureId(&local_1c,id);
  throwOnInvalidTextureOperation(this,&local_1c);
  pWVar2 = std::
           unique_ptr<solitaire::SDL::interfaces::Wrapper,_std::default_delete<solitaire::SDL::interfaces::Wrapper>_>
           ::operator->(&this->sdl);
  puVar3 = TextureId::operator_cast_to_unsigned_int_(id);
  pvVar4 = std::
           vector<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>,_std::allocator<std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_>_>
           ::operator[](&this->textures,(ulong)*puVar3);
  std::optional<SDL_Rect>::optional(&local_30);
  std::optional<SDL_Rect>::optional(&local_48);
  iVar1 = (*pWVar2->_vptr_Wrapper[0xe])(pWVar2,&this->renderer,pvVar4,&local_30,&local_48);
  if (iVar1 != 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    puVar3 = TextureId::operator_cast_to_unsigned_int_(id);
    std::runtime_error::runtime_error(this_00,"Cannot render texture with id: " + *puVar3);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void SDLGraphicsSystem::renderTextureInFullWindow(const TextureId id) const {
    throwOnInvalidTextureOperation(id);
     if (sdl->renderCopy(renderer, textures[id], std::nullopt, std::nullopt))
        throw std::runtime_error {"Cannot render texture with id: " + id};
}